

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP3Writer::~BP3Writer(BP3Writer *this)

{
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP3Writer_0086c360;
  (this->super_Engine).m_IsOpen = false;
  (this->m_FileMetadataManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0086b9b8;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileMetadataManager).m_Transports._M_h);
  (this->m_FileDataManager)._vptr_TransportMan = (_func_int **)&PTR__TransportMan_0086b9b8;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_FileDataManager).m_Transports._M_h);
  adios2::format::BP3Serializer::~BP3Serializer
            (&this->m_BP3Serializer,&adios2::format::BP3Serializer::VTT);
  adios2::format::BPBase::~BPBase((BPBase *)&(this->m_BP3Serializer).super_BP3Base.field_0xd8);
  Engine::~Engine(&this->super_Engine);
  return;
}

Assistant:

BP3Writer::~BP3Writer()
{
    if (m_IsOpen)
    {
        DestructorClose(m_FailVerbose);
    }
    m_IsOpen = false;
}